

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::TimeType::TimeType(TimeType *this,TimeType *other44)

{
  _TimeUnit__isset *p_Var1;
  
  *(undefined ***)this = &PTR__TimeType_004dd8b8;
  *(undefined ***)&this->unit = &PTR__TimeUnit_004dd7e8;
  (this->unit).MILLIS = (MilliSeconds)&PTR__MilliSeconds_004dd6b0;
  (this->unit).MICROS = (MicroSeconds)&PTR__MicroSeconds_004dd718;
  (this->unit).NANOS = (NanoSeconds)&PTR__NanoSeconds_004dd780;
  p_Var1 = &(this->unit).__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  this->isAdjustedToUTC = other44->isAdjustedToUTC;
  (this->unit).__isset = (other44->unit).__isset;
  return;
}

Assistant:

TimeType::TimeType(const TimeType& other44) noexcept {
  isAdjustedToUTC = other44.isAdjustedToUTC;
  unit = other44.unit;
}